

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void add_to_temp_string(c2m_ctx_t c2m_ctx,char *str)

{
  undefined1 uVar1;
  short sVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  c2m_ctx_t in_RAX;
  c2m_ctx_t pcVar8;
  c2m_ctx_t pcVar9;
  node_t pnVar10;
  undefined4 *puVar11;
  ulong uVar12;
  MIR_context_t pMVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  ulong *extraout_RDX;
  c2m_ctx_t pcVar17;
  c2m_ctx_t unaff_RBX;
  VARR_char *unaff_RBP;
  c2mir_options *pcVar18;
  node_t_conflict pnVar19;
  c2m_ctx_t pcVar20;
  c2m_ctx_t unaff_R13;
  short *unaff_R14;
  c2m_ctx_t unaff_R15;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  val vVar24;
  pos_t pVar25;
  val vStack_140;
  val vStack_130;
  c2m_ctx_t pcStack_120;
  c2m_ctx_t pcStack_118;
  c2m_ctx_t pcStack_110;
  short *psStack_108;
  c2m_ctx_t pcStack_100;
  c2m_ctx_t pcStack_f0;
  c2m_ctx_t pcStack_e8;
  pre_ctx *ppStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  macro_t pmStack_c8;
  macro mStack_c0;
  c2m_ctx_t pcStack_a0;
  c2m_ctx_t pcStack_98;
  c2m_ctx_t pcStack_90;
  short *psStack_88;
  c2m_ctx_t pcStack_80;
  VARR_char *pVStack_78;
  c2m_ctx_t pcStack_68;
  c2m_ctx_t pcStack_60;
  c2m_ctx_t pcStack_58;
  short *psStack_50;
  c2m_ctx_t pcStack_48;
  VARR_char *pVStack_40;
  c2m_ctx_t local_38;
  
  pcVar20 = (c2m_ctx_t)c2m_ctx->temp_string;
  pcVar17 = c2m_ctx;
  pcVar8 = unaff_R15;
  local_38 = in_RAX;
  if (pcVar20 == (c2m_ctx_t)0x0) {
LAB_00192f2e:
    pVStack_40 = (VARR_char *)0x192f33;
    add_to_temp_string_cold_4();
LAB_00192f33:
    pVStack_40 = (VARR_char *)0x192f38;
    add_to_temp_string_cold_3();
  }
  else {
    unaff_R13 = (c2m_ctx_t)pcVar20->ctx;
    unaff_RBX = c2m_ctx;
    if (unaff_R13 == (c2m_ctx_t)0x0) {
      unaff_R13 = (c2m_ctx_t)0x0;
LAB_00192e52:
      pVStack_40 = (VARR_char *)0x192e5e;
      pcVar17 = (c2m_ctx_t)str;
      local_38 = (c2m_ctx_t)str;
      pcVar8 = (c2m_ctx_t)strlen(str);
      if (pcVar8 != (c2m_ctx_t)0x0) {
        unaff_R13 = (c2m_ctx_t)0x0;
        str = (char *)local_38;
        do {
          unaff_RBP = c2m_ctx->temp_string;
          pcVar9 = (c2m_ctx_t)unaff_RBP->varr;
          if (pcVar9 == (c2m_ctx_t)0x0) {
            pVStack_40 = (VARR_char *)0x192f2e;
            add_to_temp_string_cold_2();
            goto LAB_00192f2e;
          }
          sVar16 = unaff_RBP->els_num;
          uVar1 = *(undefined1 *)
                   ((long)unaff_R13->env[0].__saved_mask.__val +
                   (long)(((c2m_ctx_t)str)->env + -1) + 0x60);
          unaff_R14 = (short *)CONCAT71((int7)((ulong)unaff_R14 >> 8),uVar1);
          uVar12 = sVar16 + 1;
          if (unaff_RBP->size < uVar12) {
            pcVar20 = (c2m_ctx_t)((uVar12 >> 1) + uVar12);
            pVStack_40 = (VARR_char *)0x192ea7;
            pcVar17 = pcVar9;
            pcVar9 = (c2m_ctx_t)realloc(pcVar9,(size_t)pcVar20);
            unaff_RBP->varr = (char *)pcVar9;
            unaff_RBP->size = (size_t)pcVar20;
            sVar16 = unaff_RBP->els_num;
            uVar12 = sVar16 + 1;
            str = (char *)local_38;
          }
          unaff_R13 = (c2m_ctx_t)((long)&unaff_R13->ctx + 1);
          unaff_RBP->els_num = uVar12;
          *(undefined1 *)((long)pcVar9->env[0].__jmpbuf + (sVar16 - 0x10)) = uVar1;
        } while (pcVar8 != unaff_R13);
        pcVar20 = (c2m_ctx_t)c2m_ctx->temp_string;
        unaff_R13 = (c2m_ctx_t)pcVar20->ctx;
        unaff_R15 = pcVar8;
      }
      pnVar10 = (node_t)pcVar20->env[0].__jmpbuf[0];
      pcVar8 = unaff_R15;
      if (pnVar10 != (node_t)0x0) {
        pMVar13 = (MIR_context_t)((long)&unaff_R13->ctx + 1);
        if ((MIR_context_t)pcVar20->options < pMVar13) {
          pcVar18 = (c2mir_options *)((long)&pMVar13->gen_ctx + ((ulong)pMVar13 >> 1));
          pVStack_40 = (VARR_char *)0x192eff;
          pnVar10 = (node_t)realloc(pnVar10,(size_t)pcVar18);
          pcVar20->env[0].__jmpbuf[0] = (long)pnVar10;
          pcVar20->options = pcVar18;
          unaff_R13 = (c2m_ctx_t)pcVar20->ctx;
          pMVar13 = (MIR_context_t)((long)&unaff_R13->ctx + 1);
        }
        pcVar20->ctx = pMVar13;
        *(undefined1 *)((long)unaff_R13->env[0].__jmpbuf + (long)&pnVar10[-1].u) = 0;
        return;
      }
      goto LAB_00192f33;
    }
    pnVar10 = (node_t)pcVar20->env[0].__jmpbuf[0];
    if (pnVar10 != (node_t)0x0) {
      pcVar17 = (c2m_ctx_t)((long)&unaff_R13[-1].gen_ctx + 7);
      if (*(char *)((long)pcVar17->env[0].__jmpbuf + (long)&pnVar10[-1].u) == '\0') {
        pcVar20->ctx = (MIR_context_t)pcVar17;
        unaff_R13 = pcVar17;
      }
      goto LAB_00192e52;
    }
  }
  pVStack_40 = (VARR_char *)check_pragma;
  add_to_temp_string_cold_1();
  pcStack_68 = unaff_RBX;
  pcStack_60 = pcVar20;
  pcStack_58 = unaff_R13;
  psStack_50 = unaff_R14;
  pcStack_48 = pcVar8;
  pVStack_40 = unaff_RBP;
  if (extraout_RDX != (ulong *)0x0) {
    uVar12 = *extraout_RDX;
    puVar3 = (undefined8 *)extraout_RDX[2];
    if (uVar12 == 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)(*(short *)*puVar3 == 0x20);
    }
    if ((uVar12 <= uVar21) || (*(short *)puVar3[uVar21] != 0x103)) {
LAB_00192f9c:
      warning(pcVar17,0x1c18f0,(char *)((c2m_ctx_t)str)->options,
              (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0]);
      return;
    }
    pVStack_78 = (VARR_char *)0x192f98;
    iVar5 = strcmp(*(char **)((short *)puVar3[uVar21] + 0x14),"STDC");
    if (iVar5 != 0) goto LAB_00192f9c;
    uVar22 = uVar21 + 1;
    if ((uVar22 < uVar12) && (*(short *)puVar3[uVar21 + 1] == 0x20)) {
      uVar22 = uVar21 | 2;
    }
    if ((uVar22 < uVar12) && (*(short *)puVar3[uVar22] == 0x103)) {
      pcVar15 = *(char **)((short *)puVar3[uVar22] + 0x14);
      pVStack_78 = (VARR_char *)0x193001;
      iVar5 = strcmp(pcVar15,"FP_CONTRACT");
      if (iVar5 != 0) {
        pVStack_78 = (VARR_char *)0x193014;
        iVar5 = strcmp(pcVar15,"FENV_ACCESS");
        if (iVar5 != 0) {
          pVStack_78 = (VARR_char *)0x193027;
          iVar5 = strcmp(pcVar15,"CX_LIMITED_RANGE");
          if (iVar5 != 0) {
            pcVar18 = ((c2m_ctx_t)str)->options;
            pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
            pcVar14 = "unknown STDC pragma %s";
            goto LAB_001930e8;
          }
        }
      }
      uVar21 = uVar22 + 1;
      if ((uVar21 < uVar12) && (*(short *)puVar3[uVar22 + 1] == 0x20)) {
        uVar21 = uVar22 + 2;
      }
      if ((uVar21 < uVar12) && (*(short *)puVar3[uVar21] == 0x103)) {
        pcVar15 = *(char **)((short *)puVar3[uVar21] + 0x14);
        if (((*pcVar15 != 'O') || (pcVar15[1] != 'N')) || (pcVar15[2] != '\0')) {
          pVStack_78 = (VARR_char *)0x1930bc;
          iVar5 = strcmp(pcVar15,"OFF");
          if (iVar5 != 0) {
            pVStack_78 = (VARR_char *)0x1930cf;
            iVar5 = strcmp(pcVar15,"DEFAULT");
            if (iVar5 != 0) {
              pcVar18 = ((c2m_ctx_t)str)->options;
              pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
              pcVar14 = "unknown STDC pragma value";
LAB_001930e8:
              error(pcVar17,pcVar14,(char *)pcVar18,pnVar10,pcVar15);
              return;
            }
          }
        }
        uVar22 = uVar21 + 1;
        if ((uVar22 < uVar12) &&
           ((*(short *)puVar3[uVar21 + 1] == 0x20 || (*(short *)puVar3[uVar21 + 1] == 10)))) {
          uVar22 = uVar21 + 2;
        }
        if (uVar12 <= uVar22) {
          return;
        }
        pcVar18 = ((c2m_ctx_t)str)->options;
        pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
        pcVar15 = "garbage at STDC pragma end";
      }
      else {
        pcVar18 = ((c2m_ctx_t)str)->options;
        pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
        pcVar15 = "wrong STDC pragma value";
      }
    }
    else {
      pcVar18 = ((c2m_ctx_t)str)->options;
      pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
      pcVar15 = "wrong STDC pragma";
    }
    error(pcVar17,pcVar15,(char *)pcVar18,pnVar10);
    return;
  }
  pVStack_78 = (VARR_char *)replace_defined;
  check_pragma_cold_1();
  pcVar15 = str;
  pcStack_e8 = pcVar17;
  pcStack_a0 = unaff_RBX;
  pcStack_98 = pcVar20;
  pcStack_90 = unaff_R13;
  psStack_88 = unaff_R14;
  pcStack_80 = pcVar8;
  pVStack_78 = unaff_RBP;
  if ((c2m_ctx_t)str != (c2m_ctx_t)0x0) {
    pcVar20 = (c2m_ctx_t)((c2m_ctx_t)str)->ctx;
    if (pcVar20 != (c2m_ctx_t)0x0) {
      iVar5 = 0;
      ppStack_e0 = pcVar17->pre_ctx;
      pcVar8 = (c2m_ctx_t)&DAT_00000001;
      do {
        pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
        if (pnVar10 == (node_t)0x0) {
          pcStack_100 = (c2m_ctx_t)0x1933e6;
          replace_defined_cold_3();
          unaff_R13 = (c2m_ctx_t)0x0;
LAB_001933e6:
          pcStack_100 = (c2m_ctx_t)0x1933eb;
          replace_defined_cold_2();
          unaff_RBX = (c2m_ctx_t)str;
          goto LAB_001933eb;
        }
        unaff_R14 = (short *)(&pnVar10[1].attr)[(long)&pcVar8[-1].gen_ctx];
        unaff_R13 = pcVar17;
        if (*unaff_R14 == 0x103) {
          unaff_R13 = *(c2m_ctx_t *)(unaff_R14 + 0x14);
          pcVar15 = "defined";
          pcStack_100 = (c2m_ctx_t)0x1931d2;
          iVar6 = strcmp((char *)unaff_R13,"defined");
          if (iVar6 == 0) {
            pcVar17 = pcVar8;
            if ((pcVar8 < pcVar20) && (**(short **)(&pnVar10->code + (long)pcVar8 * 2) == 0x20)) {
              pcVar17 = (c2m_ctx_t)((long)&pcVar8->ctx + 1);
            }
            if (pcVar17 < pcVar20) {
              unaff_R13 = (c2m_ctx_t)((long)&pcVar8[-1].gen_ctx + 7);
              sVar2 = *(short *)*(token_t *)(&pnVar10->code + (long)pcVar17 * 2);
              if (sVar2 == 0x28) {
                pcVar9 = (c2m_ctx_t)((long)&pcVar17->ctx + 1);
                if ((pcVar9 < pcVar20) && (*(&pnVar10->attr)[(long)&pcVar17->ctx] == 0x20)) {
                  pcVar9 = (c2m_ctx_t)((long)&pcVar17->ctx + 2);
                }
                if ((pcVar9 < pcVar20) &&
                   (*(short *)*(token_t *)(&pnVar10->code + (long)pcVar9 * 2) == 0x103)) {
                  pcVar15 = (char *)((long)&pcVar9->ctx + 1);
                  if ((pcVar15 < pcVar20) && (*(&pnVar10->attr)[(long)&pcVar9->ctx] == 0x20)) {
                    pcVar15 = (char *)((long)&pcVar9->ctx + 2);
                  }
                  if ((pcVar15 < pcVar20) &&
                     (**(short **)(&pnVar10->code + (long)pcVar15 * 2) == 0x29)) {
                    pcStack_100 = (c2m_ctx_t)0x193358;
                    pcStack_f0 = (c2m_ctx_t)pcVar15;
                    mStack_c0.id = *(token_t *)(&pnVar10->code + (long)pcVar9 * 2);
                    iVar6 = HTAB_macro_t_do(ppStack_e0->macro_tab,&mStack_c0,HTAB_FIND,&pmStack_c8);
                    pcVar20 = (c2m_ctx_t)0x1b530d;
                    if (iVar6 != 0) {
                      pcVar20 = (c2m_ctx_t)0x1b3967;
                    }
                    uStack_d8 = *(undefined8 *)(unaff_R14 + 4);
                    uStack_d0 = *(undefined8 *)(unaff_R14 + 8);
                    pcVar15 = (char *)0x30;
                    pcStack_100 = (c2m_ctx_t)0x193385;
                    pcVar17 = pcStack_e8;
                    puVar11 = (undefined4 *)reg_malloc(pcStack_e8,0x30);
                    *puVar11 = 0x100;
                    *(undefined8 *)(puVar11 + 2) = uStack_d8;
                    *(undefined8 *)(puVar11 + 4) = uStack_d0;
                    *(c2m_ctx_t *)(puVar11 + 10) = pcVar20;
                    puVar11[6] = 0;
                    *(undefined8 *)(puVar11 + 8) = 0;
                    pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
                    if ((pnVar10 != (node_t)0x0) && (unaff_R13 < (c2m_ctx_t)((c2m_ctx_t)str)->ctx))
                    goto LAB_001932ae;
                    goto LAB_001933f0;
                  }
                }
              }
              else if (sVar2 == 0x103) {
                pcStack_100 = (c2m_ctx_t)0x193247;
                pcStack_f0 = pcVar17;
                mStack_c0.id = *(token_t *)(&pnVar10->code + (long)pcVar17 * 2);
                iVar6 = HTAB_macro_t_do(ppStack_e0->macro_tab,&mStack_c0,HTAB_FIND,&pmStack_c8);
                pcVar20 = (c2m_ctx_t)0x1b530d;
                if (iVar6 != 0) {
                  pcVar20 = (c2m_ctx_t)0x1b3967;
                }
                uStack_d8 = *(undefined8 *)(unaff_R14 + 4);
                uStack_d0 = *(undefined8 *)(unaff_R14 + 8);
                pcVar15 = (char *)0x30;
                pcStack_100 = (c2m_ctx_t)0x193274;
                pcVar17 = pcStack_e8;
                puVar11 = (undefined4 *)reg_malloc(pcStack_e8,0x30);
                *puVar11 = 0x100;
                *(undefined8 *)(puVar11 + 2) = uStack_d8;
                *(undefined8 *)(puVar11 + 4) = uStack_d0;
                *(c2m_ctx_t *)(puVar11 + 10) = pcVar20;
                puVar11[6] = 0;
                *(undefined8 *)(puVar11 + 8) = 0;
                pnVar10 = (node_t)((c2m_ctx_t)str)->env[0].__jmpbuf[0];
                if ((pnVar10 == (node_t)0x0) || ((c2m_ctx_t)((c2m_ctx_t)str)->ctx <= unaff_R13))
                goto LAB_001933e6;
LAB_001932ae:
                (&pnVar10[1].attr)[(long)&pcVar8[-1].gen_ctx] = puVar11;
                pcVar15 = (char *)((ulong)pcVar8 & 0xffffffff);
                pcStack_100 = (c2m_ctx_t)0x1932c5;
                unaff_R13 = (c2m_ctx_t)str;
                del_tokens((VARR_token_t *)str,(int)pcVar8,(int)pcStack_f0 + iVar5);
              }
            }
          }
        }
        pcVar20 = (c2m_ctx_t)((c2m_ctx_t)str)->ctx;
        iVar5 = iVar5 + -1;
        bVar23 = pcVar8 < pcVar20;
        pcVar17 = unaff_R13;
        pcVar8 = (c2m_ctx_t)((long)&pcVar8->ctx + 1);
      } while (bVar23);
    }
    return;
  }
LAB_001933eb:
  pcStack_100 = (c2m_ctx_t)0x1933f0;
  replace_defined_cold_4();
  str = (char *)unaff_RBX;
LAB_001933f0:
  pcStack_100 = (c2m_ctx_t)eval;
  replace_defined_cold_1();
  pcStack_120 = (c2m_ctx_t)str;
  pcStack_118 = pcVar20;
  pcStack_110 = unaff_R13;
  psStack_108 = unaff_R14;
  pcStack_100 = pcVar8;
  switch(*(node_code_t *)&((c2m_ctx_t)pcVar15)->ctx) {
  case N_IGNORE:
    pVar25 = get_node_pos((c2m_ctx_t)pcVar17->node_positions,
                          (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar15)->ctx + 4));
    error(pcVar17,0x1c15f3,pVar25.fname,pVar25._8_8_);
    break;
  case N_I:
  case N_L:
  case N_LL:
    break;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    break;
  case N_ANDAND:
  case N_OROR:
    vVar24 = eval(pcVar17,(node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2]);
    if (*(node_code_t *)&((c2m_ctx_t)pcVar15)->ctx == N_ANDAND) {
      if (vVar24.u.i_val == 0) {
        return;
      }
    }
    else if (vVar24.u.i_val != 0) {
      return;
    }
    lVar4 = ((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2];
    if (lVar4 == 0) {
      pnVar19 = (node_t_conflict)0x0;
    }
    else {
      pnVar19 = *(node_t_conflict *)(lVar4 + 0x18);
    }
    eval(pcVar17,pnVar19);
    break;
  case N_EQ:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_NE:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_LT:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_LE:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_GT:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_GE:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_BITWISE_NOT:
    eval(pcVar17,(node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2]);
    break;
  case N_NOT:
    eval(pcVar17,(node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2]);
    break;
  case N_AND:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_OR:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_XOR:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_LSH:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_RSH:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_ADD:
    pnVar19 = (node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2];
    if ((pnVar19 != (node_t_conflict)0x0) && ((pnVar19->op_link).next != (node_t)0x0)) {
      eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
      return;
    }
    goto LAB_001938c6;
  case N_SUB:
    pnVar19 = (node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2];
    if ((pnVar19 == (node_t_conflict)0x0) || ((pnVar19->op_link).next == (node_t)0x0)) {
      eval(pcVar17,pnVar19);
    }
    else {
      eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    }
    break;
  case N_MUL:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    break;
  case N_DIV:
  case N_MOD:
    eval_binop_operands(pcVar17,(node_t_conflict)pcVar15,&vStack_140,&vStack_130);
    if (vStack_130.u.i_val == 0) {
      pVar25 = get_node_pos((c2m_ctx_t)pcVar17->node_positions,
                            (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar15)->ctx + 4))
      ;
      pcVar14 = "%";
      if (*(node_code_t *)&((c2m_ctx_t)pcVar15)->ctx == N_DIV) {
        pcVar14 = "/";
      }
      error(pcVar17,0x1c1611,pVar25.fname,pVar25._8_8_,pcVar14);
    }
    break;
  case N_COND:
    vVar24 = eval(pcVar17,(node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2]);
    pnVar19 = (node_t_conflict)((c2m_ctx_t)pcVar15)->env[0].__jmpbuf[2];
    if (pnVar19 == (node_t_conflict)0x0) {
      pnVar19 = (node_t_conflict)0x0;
    }
    else {
      uVar7 = (uint)(vVar24.u.i_val == 0);
      do {
        pnVar19 = (pnVar19->op_link).next;
        bVar23 = uVar7 != 0;
        uVar7 = uVar7 - 1;
        if (pnVar19 == (node_t_conflict)0x0) break;
      } while (bVar23);
    }
LAB_001938c6:
    eval(pcVar17,pnVar19);
  }
  return;
}

Assistant:

static void add_to_temp_string (c2m_ctx_t c2m_ctx, const char *str) {
  size_t i, len;

  if ((len = VARR_LENGTH (char, temp_string)) != 0
      && VARR_GET (char, temp_string, len - 1) == '\0') {
    VARR_POP (char, temp_string);
  }
  len = strlen (str);
  for (i = 0; i < len; i++) VARR_PUSH (char, temp_string, str[i]);
  VARR_PUSH (char, temp_string, '\0');
}